

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O1

void __thiscall
libsbox::Task::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Task *this,Value *value)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ushort uVar1;
  undefined8 uVar2;
  Task *pTVar3;
  ContextManager *pCVar4;
  Number NVar5;
  Type pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  ulong uVar8;
  Data local_80;
  Data local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Task *local_38;
  
  if ((value->data_).f.flags != 3) {
    pCVar4 = ContextManager::get();
    local_80.n = (Number)&local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
    if (local_80.n.i64 != (Number)&local_70) {
      operator_delete((void *)local_80.n,(long)local_70.n + 1);
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_80.s,(Ch *)value);
  uVar2 = local_80.n;
  NVar5.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(value);
  if (uVar2 == NVar5.i64) {
    pCVar4 = ContextManager::get();
    local_80.n = (Number)&local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
    if (local_80.n.i64 != (Number)&local_70) {
      operator_delete((void *)local_80.n,(long)local_70.n + 1);
    }
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"time_limit_ms");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
      (undefined1  [16])0x0) {
    pCVar4 = ContextManager::get();
    local_80.n = (Number)&local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
    if (local_80.n.i64 != (Number)&local_70) {
      operator_delete((void *)local_80.n,(long)local_70.n + 1);
    }
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"time_limit_ms");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) !=
      (undefined1  [16])0x0) {
    this->time_limit_ms_ = (time_ms_t)(pGVar6->data_).n;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_80.s,(Ch *)value);
    uVar2 = local_80.n;
    NVar5.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(value);
    if (uVar2 == NVar5.i64) {
      pCVar4 = ContextManager::get();
      local_80.n = (Number)&local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
      if (local_80.n.i64 != (Number)&local_70) {
        operator_delete((void *)local_80.n,(long)local_70.n + 1);
      }
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"wall_time_limit_ms");
    if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
        (undefined1  [16])0x0) {
      pCVar4 = ContextManager::get();
      local_80.n = (Number)&local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
      if (local_80.n.i64 != (Number)&local_70) {
        operator_delete((void *)local_80.n,(long)local_70.n + 1);
      }
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"wall_time_limit_ms");
    if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) !=
        (undefined1  [16])0x0) {
      this->wall_time_limit_ms_ = (time_ms_t)(pGVar6->data_).n;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_80.s,(Ch *)value);
      uVar2 = local_80.n;
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(value);
      if (uVar2 == NVar5.i64) {
        pCVar4 = ContextManager::get();
        local_80.n = (Number)&local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
        if (local_80.n.i64 != (Number)&local_70) {
          operator_delete((void *)local_80.n,(long)local_70.n + 1);
        }
      }
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"memory_limit_kb");
      if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000)
          == (undefined1  [16])0x0) {
        pCVar4 = ContextManager::get();
        local_80.n = (Number)&local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
        if (local_80.n.i64 != (Number)&local_70) {
          operator_delete((void *)local_80.n,(long)local_70.n + 1);
        }
      }
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"memory_limit_kb");
      if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000)
          != (undefined1  [16])0x0) {
        this->memory_limit_kb_ = (memory_kb_t)(pGVar6->data_).n;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_80.s,(Ch *)value);
        uVar2 = local_80.n;
        NVar5.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(value);
        if (uVar2 == NVar5.i64) {
          pCVar4 = ContextManager::get();
          local_80.n = (Number)&local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"JSON is incorrect","");
          (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
          if (local_80.n.i64 != (Number)&local_70) {
            operator_delete((void *)local_80.n,(long)local_70.n + 1);
          }
        }
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)value,"fsize_limit_kb");
        if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000)
            == (undefined1  [16])0x0) {
          pCVar4 = ContextManager::get();
          local_80.n = (Number)&local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"JSON is incorrect","");
          (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
          if (local_80.n.i64 != (Number)&local_70) {
            operator_delete((void *)local_80.n,(long)local_70.n + 1);
          }
        }
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)value,"fsize_limit_kb");
        if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000)
            != (undefined1  [16])0x0) {
          this->fsize_limit_kb_ = (memory_kb_t)(pGVar6->data_).n;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_80.s,(Ch *)value);
          uVar2 = local_80.n;
          NVar5.i = (I)rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::MemberEnd(value);
          if (uVar2 == NVar5.i64) {
            pCVar4 = ContextManager::get();
            local_80.n = (Number)&local_70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"JSON is incorrect","");
            (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
            if (local_80.n.i64 != (Number)&local_70) {
              operator_delete((void *)local_80.n,(long)local_70.n + 1);
            }
          }
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"max_files");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
              (undefined1  [16])0x0) {
            pCVar4 = ContextManager::get();
            local_80.n = (Number)&local_70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"JSON is incorrect","");
            (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
            if (local_80.n.i64 != (Number)&local_70) {
              operator_delete((void *)local_80.n,(long)local_70.n + 1);
            }
          }
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"max_files");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) !=
              (undefined1  [16])0x0) {
            this->max_files_ = (pGVar6->data_).s.length;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_80.s,(Ch *)value);
            uVar2 = local_80.n;
            NVar5.i = (I)rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::MemberEnd(value);
            if (uVar2 == NVar5.i64) {
              pCVar4 = ContextManager::get();
              local_80.n = (Number)&local_70;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"JSON is incorrect","");
              (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
              if (local_80.n.i64 != (Number)&local_70) {
                operator_delete((void *)local_80.n,(long)local_70.n + 1);
              }
            }
            pGVar6 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)value,"max_threads");
            if ((undefined1  [16])
                ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
                (undefined1  [16])0x0) {
              pCVar4 = ContextManager::get();
              local_80.n = (Number)&local_70;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"JSON is incorrect","");
              (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
              if (local_80.n.i64 != (Number)&local_70) {
                operator_delete((void *)local_80.n,(long)local_70.n + 1);
              }
            }
            pGVar6 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)value,"max_threads");
            if ((undefined1  [16])
                ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) !=
                (undefined1  [16])0x0) {
              this->max_threads_ = (pGVar6->data_).s.length;
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_80.s,(Ch *)value);
              uVar2 = local_80.n;
              NVar5.i = (I)rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::MemberEnd(value);
              if (uVar2 == NVar5.i64) {
                pCVar4 = ContextManager::get();
                local_80.n = (Number)&local_70;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_80,"JSON is incorrect","");
                (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                if (local_80.n.i64 != (Number)&local_70) {
                  operator_delete((void *)local_80.n,(long)local_70.n + 1);
                }
              }
              pGVar6 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)value,"need_ipc");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x8000000000000) ==
                  (undefined1  [16])0x0) {
                pCVar4 = ContextManager::get();
                local_80.n = (Number)&local_70;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_80,"JSON is incorrect","");
                (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                if (local_80.n.i64 != (Number)&local_70) {
                  operator_delete((void *)local_80.n,(long)local_70.n + 1);
                }
              }
              pGVar6 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)value,"need_ipc");
              uVar1 = (pGVar6->data_).f.flags;
              if ((uVar1 & 8) != 0) {
                this->need_ipc_ = uVar1 == 10;
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_80.s,(Ch *)value);
                uVar2 = local_80.n;
                NVar5.i = (I)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd(value);
                if (uVar2 == NVar5.i64) {
                  pCVar4 = ContextManager::get();
                  local_80.n = (Number)&local_70;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_80,"JSON is incorrect","");
                  (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                  if (local_80.n.i64 != (Number)&local_70) {
                    operator_delete((void *)local_80.n,(long)local_70.n + 1);
                  }
                }
                pGVar6 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)value,"use_standard_binds");
                if ((undefined1  [16])
                    ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x8000000000000) ==
                    (undefined1  [16])0x0) {
                  pCVar4 = ContextManager::get();
                  local_80.n = (Number)&local_70;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_80,"JSON is incorrect","");
                  (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                  if (local_80.n.i64 != (Number)&local_70) {
                    operator_delete((void *)local_80.n,(long)local_70.n + 1);
                  }
                }
                pGVar6 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)value,"use_standard_binds");
                uVar1 = (pGVar6->data_).f.flags;
                if ((uVar1 & 8) != 0) {
                  this->use_standard_binds_ = uVar1 == 10;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_80.s,(Ch *)value);
                  uVar2 = local_80.n;
                  NVar5.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd(value);
                  if (uVar2 == NVar5.i64) {
                    pCVar4 = ContextManager::get();
                    local_80.n = (Number)&local_70;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"JSON is incorrect","");
                    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                    if (local_80.n.i64 != (Number)&local_70) {
                      operator_delete((void *)local_80.n,(long)local_70.n + 1);
                    }
                  }
                  pGVar6 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"stdin");
                  Stream::
                  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&this->stdin_,pGVar6);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_80.s,(Ch *)value);
                  uVar2 = local_80.n;
                  NVar5.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd(value);
                  if (uVar2 == NVar5.i64) {
                    pCVar4 = ContextManager::get();
                    local_80.n = (Number)&local_70;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"JSON is incorrect","");
                    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                    if (local_80.n.i64 != (Number)&local_70) {
                      operator_delete((void *)local_80.n,(long)local_70.n + 1);
                    }
                  }
                  pGVar6 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"stdout");
                  Stream::
                  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&this->stdout_,pGVar6);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_80.s,(Ch *)value);
                  uVar2 = local_80.n;
                  NVar5.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd(value);
                  if (uVar2 == NVar5.i64) {
                    pCVar4 = ContextManager::get();
                    local_80.n = (Number)&local_70;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"JSON is incorrect","");
                    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                    if (local_80.n.i64 != (Number)&local_70) {
                      operator_delete((void *)local_80.n,(long)local_70.n + 1);
                    }
                  }
                  pGVar6 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"stderr");
                  Stream::
                  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&(this->stderr_).super_Stream,pGVar6);
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_80.s,(Ch *)value);
                  uVar2 = local_80.n;
                  NVar5.i = (I)rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::MemberEnd(value);
                  if (uVar2 == NVar5.i64) {
                    pCVar4 = ContextManager::get();
                    local_80.n = (Number)&local_70;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"JSON is incorrect","");
                    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                    if (local_80.n.i64 != (Number)&local_70) {
                      operator_delete((void *)local_80.n,(long)local_70.n + 1);
                    }
                  }
                  pGVar6 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"argv");
                  if ((pGVar6->data_).f.flags != 4) {
                    pCVar4 = ContextManager::get();
                    local_80.n = (Number)&local_70;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_80,"JSON is incorrect","");
                    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                    if (local_80.n.i64 != (Number)&local_70) {
                      operator_delete((void *)local_80.n,(long)local_70.n + 1);
                    }
                  }
                  local_38 = this;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase_at_end(&this->argv_,
                                    (this->argv_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  pGVar6 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)value,"argv");
                  if ((pGVar6->data_).f.flags == 4) {
                    uVar8 = 0;
                    do {
                      if ((pGVar6->data_).s.length <= uVar8) {
                        rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)&local_80.s,(Ch *)value);
                        uVar2 = local_80.n;
                        NVar5.i = (I)rapidjson::
                                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                     ::MemberEnd(value);
                        pTVar3 = local_38;
                        if (uVar2 == NVar5.i64) {
                          pCVar4 = ContextManager::get();
                          local_80.n = (Number)&local_70;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_80,"JSON is incorrect","");
                          (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                          if (local_80.n.i64 != (Number)&local_70) {
                            operator_delete((void *)local_80.n,(long)local_70.n + 1);
                          }
                        }
                        pGVar6 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>
                                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             *)value,"env");
                        if ((pGVar6->data_).f.flags != 4) {
                          pCVar4 = ContextManager::get();
                          local_80.n = (Number)&local_70;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_80,"JSON is incorrect","");
                          (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                          if (local_80.n.i64 != (Number)&local_70) {
                            operator_delete((void *)local_80.n,(long)local_70.n + 1);
                          }
                        }
                        this_00 = &pTVar3->env_;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::_M_erase_at_end(this_00,(pTVar3->env_).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        pGVar6 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>
                                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             *)value,"env");
                        if ((pGVar6->data_).f.flags == 4) {
                          uVar8 = 0;
                          goto LAB_0010b923;
                        }
                        break;
                      }
                      pGVar6 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)value,"argv");
                      pGVar7 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::operator[](pGVar6,(SizeType)uVar8);
                      if ((undefined1  [16])
                          ((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) ==
                          (undefined1  [16])0x0) {
                        pCVar4 = ContextManager::get();
                        local_80.n = (Number)&local_70;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_80,"JSON is incorrect","");
                        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
                        if (local_80.n.i64 != (Number)&local_70) {
                          operator_delete((void *)local_80.n,(long)local_70.n + 1);
                        }
                      }
                      pGVar6 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)value,"argv");
                      pGVar7 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               ::operator[](pGVar6,(SizeType)uVar8);
                      local_80.n = (Number)rapidjson::
                                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                           ::GetString(pGVar7);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&this->argv_,(char **)&local_80.n);
                      uVar8 = uVar8 + 1;
                      pGVar6 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)value,"argv");
                    } while ((pGVar6->data_).f.flags == 4);
                  }
                  goto LAB_0010bc11;
                }
              }
              __assert_fail("IsBool()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                            ,0x498,
                            "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                           );
            }
          }
          __assert_fail("data_.f.flags & kIntFlag",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                        ,0x719,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kInt64Flag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x71b,
                "int64_t rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt64() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
  while( true ) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar8);
    if ((undefined1  [16])((undefined1  [16])pGVar7->data_ & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pCVar4 = ContextManager::get();
      local_80.n = (Number)&local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
      if (local_80.n.i64 != (Number)&local_70) {
        operator_delete((void *)local_80.n,(long)local_70.n + 1);
      }
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar8);
    local_80.n = (Number)rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::GetString(pGVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char **)&local_80.n);
    uVar8 = uVar8 + 1;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    if ((pGVar6->data_).f.flags != 4) break;
LAB_0010b923:
    if ((pGVar6->data_).s.length <= uVar8) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_80.s,(Ch *)value);
      uVar2 = local_80.n;
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(value);
      pTVar3 = local_38;
      if (uVar2 == NVar5.i64) {
        pCVar4 = ContextManager::get();
        local_80.n = (Number)&local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
        if (local_80.n.i64 != (Number)&local_70) {
          operator_delete((void *)local_80.n,(long)local_70.n + 1);
        }
      }
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"binds");
      if ((pGVar6->data_).f.flags != 4) {
        pCVar4 = ContextManager::get();
        local_80.n = (Number)&local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"JSON is incorrect","");
        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
        if (local_80.n.i64 != (Number)&local_70) {
          operator_delete((void *)local_80.n,(long)local_70.n + 1);
        }
      }
      local_38 = (Task *)&pTVar3->binds_;
      std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::_M_erase_at_end
                ((vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_> *)local_38,
                 (pTVar3->binds_).
                 super__Vector_base<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"binds");
      if ((pGVar6->data_).f.flags == 4) {
        uVar8 = 0;
        do {
          if ((pGVar6->data_).s.length <= uVar8) {
            return;
          }
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"binds");
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pGVar6,(SizeType)uVar8);
          if ((pGVar7->data_).f.flags != 3) {
            pCVar4 = ContextManager::get();
            local_80.n = (Number)&local_70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,"JSON is incorrect","");
            (**pCVar4->_vptr_ContextManager)(pCVar4,&local_80);
            if (local_80.n.i64 != (Number)&local_70) {
              operator_delete((void *)local_80.n,(long)local_70.n + 1);
            }
          }
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"binds");
          pGVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pGVar6,(SizeType)uVar8);
          BindRule::
          BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    ((BindRule *)&local_80.s,pGVar7);
          std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::
          emplace_back<libsbox::BindRule>
                    ((vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_> *)local_38,
                     (BindRule *)&local_80.s);
          if (local_60 != &local_50) {
            operator_delete(local_60,local_50._M_allocated_capacity + 1);
          }
          if (local_80.n.i64 != (Number)&local_70) {
            operator_delete((void *)local_80.n,(long)local_70.n + 1);
          }
          uVar8 = uVar8 + 1;
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)value,"binds");
        } while ((pGVar6->data_).f.flags == 4);
      }
      break;
    }
  }
LAB_0010bc11:
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x66b,
                "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

void Task::deserialize_request(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_limit_ms_, value, "time_limit_ms", Int64);
    GET_MEMBER(wall_time_limit_ms_, value, "wall_time_limit_ms", Int64);
    GET_MEMBER(memory_limit_kb_, value, "memory_limit_kb", Int64);
    GET_MEMBER(fsize_limit_kb_, value, "fsize_limit_kb", Int64);
    GET_MEMBER(max_files_, value, "max_files", Int);
    GET_MEMBER(max_threads_, value, "max_threads", Int);
    GET_MEMBER(need_ipc_, value, "need_ipc", Bool);
    GET_MEMBER(use_standard_binds_, value, "use_standard_binds", Bool);
    CHECK_MEMBER(value, "stdin");
    stdin_.deserialize_request(value["stdin"]);
    CHECK_MEMBER(value, "stdout");
    stdout_.deserialize_request(value["stdout"]);
    CHECK_MEMBER(value, "stderr");
    stderr_.deserialize_request(value["stderr"]);
    CHECK_MEMBER(value, "argv");
    CHECK_TYPE(value["argv"], Array);
    argv_.clear();
    for (size_t i = 0; i < value["argv"].Size(); ++i) {
        CHECK_TYPE(value["argv"][i], String);
        argv_.emplace_back(value["argv"][i].GetString());
    }
    CHECK_MEMBER(value, "env");
    CHECK_TYPE(value["env"], Array);
    env_.clear();
    for (size_t i = 0; i < value["env"].Size(); ++i) {
        CHECK_TYPE(value["env"][i], String);
        env_.emplace_back(value["env"][i].GetString());
    }
    CHECK_MEMBER(value, "binds");
    CHECK_TYPE(value["binds"], Array);
    binds_.clear();
    for (size_t i = 0; i < value["binds"].Size(); ++i) {
        CHECK_TYPE(value["binds"][i], Object);
        binds_.push_back(BindRule(value["binds"][i]));
    }
}